

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O1

void biftim(bifcxdef *ctx,int argc)

{
  runsdef *prVar1;
  runcxdef *ctx_00;
  int32_t tmp_3;
  int iVar2;
  tm *ptVar3;
  long num;
  time_t timer;
  runsdef val;
  uchar ret [80];
  time_t local_80;
  runsdef local_78;
  undefined2 local_68;
  undefined1 local_66;
  int local_65;
  undefined1 local_61;
  int local_60;
  undefined1 local_5c;
  int local_5b;
  undefined1 local_57;
  int local_56;
  undefined1 local_52;
  int local_51;
  undefined1 local_4d;
  int local_4c;
  undefined1 local_48;
  int local_47;
  undefined1 local_43;
  int local_42;
  undefined1 local_3e;
  undefined4 local_3d;
  
  iVar2 = 1;
  if (argc == 1) {
    prVar1 = ctx->bifcxrun->runcxsp;
    ctx->bifcxrun->runcxsp = prVar1 + -1;
    if (prVar1[-1].runstyp != '\x01') {
      ctx->bifcxrun->runcxerr->errcxptr->erraac = 0;
      runsign(ctx->bifcxrun,0x3eb);
    }
    iVar2 = *(int *)&ctx->bifcxrun->runcxsp->runsv;
  }
  if (iVar2 != 2) {
    if (iVar2 == 1) {
      local_80 = time((time_t *)0x0);
      ptVar3 = localtime(&local_80);
      local_60 = ptVar3->tm_mon + 1;
      local_65 = ptVar3->tm_year + 0x76c;
      local_56 = ptVar3->tm_wday + 1;
      local_51 = ptVar3->tm_yday + 1;
      ptVar3->tm_mon = local_60;
      ptVar3->tm_year = local_65;
      ptVar3->tm_wday = local_56;
      ptVar3->tm_yday = local_51;
      local_78.runsv.runsvstr = (uchar *)&local_68;
      local_68 = 0x2f;
      local_66 = 1;
      local_61 = 1;
      local_5b = ptVar3->tm_mday;
      local_5c = 1;
      local_57 = 1;
      local_52 = 1;
      local_4c = ptVar3->tm_hour;
      local_4d = 1;
      local_47 = ptVar3->tm_min;
      local_48 = 1;
      local_42 = ptVar3->tm_sec;
      local_43 = 1;
      local_3e = 1;
      local_3d = (undefined4)local_80;
      local_78.runstyp = '\a';
      runpush(ctx->bifcxrun,7,&local_78);
      return;
    }
    ctx->bifcxrun->runcxerr->errcxptr->erraav[0].errastr = "gettime";
    ctx->bifcxrun->runcxerr->errcxptr->erraac = 1;
    runsign(ctx->bifcxrun,0x400);
  }
  ctx_00 = ctx->bifcxrun;
  num = os_get_sys_clock_ms();
  runpnum(ctx_00,num);
  return;
}

Assistant:

void biftim(bifcxdef *ctx, int argc)
{
    time_t     timer;
    struct tm *tblock;
    uchar      ret[80];
    uchar     *p;
    runsdef    val;
    int        typ;

    if (argc == 1)
    {
        /* get the time type */
        typ = (int)runpopnum(ctx->bifcxrun);
    }
    else
    {
        /* make sure no arguments are specified */
        bifcntargs(ctx, 0, argc);

        /* use the default time type */
        typ = 1;
    }

    switch(typ)
    {
    case 1:
        /* 
         *   default information format - list format with current system
         *   time and date 
         */

        /* make sure the time zone is set up properly */
        os_tzset();
        
        /* get the local time information */
        timer = time(NULL);
        tblock = localtime(&timer);
        
        /* adjust values for return format */
        tblock->tm_year += 1900;
        tblock->tm_mon++;
        tblock->tm_wday++;
        tblock->tm_yday++;
        
        /* build return list value */
        oswp2(ret, 47);
        p = ret + 2;
        p = bifputnum(p, tblock->tm_year);
        p = bifputnum(p, tblock->tm_mon);
        p = bifputnum(p, tblock->tm_mday);
        p = bifputnum(p, tblock->tm_wday);
        p = bifputnum(p, tblock->tm_yday);
        p = bifputnum(p, tblock->tm_hour);
        p = bifputnum(p, tblock->tm_min);
        p = bifputnum(p, tblock->tm_sec);
        *p++ = DAT_NUMBER;
        oswp4s(p, (long)timer);
        
        val.runstyp = DAT_LIST;
        val.runsv.runsvstr = ret;
        runpush(ctx->bifcxrun, DAT_LIST, &val);
        break;

    case 2:
        /*
         *   High-precision system timer value - returns the system time
         *   in milliseconds, relative to an arbitrary zero point 
         */
        runpnum(ctx->bifcxrun, os_get_sys_clock_ms());
        break;

    default:
        /* other types are invalid */
        runsig1(ctx->bifcxrun, ERR_INVVBIF, ERRTSTR, "gettime");
        break;
    }
}